

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hashtable_unittests.cc
# Opt level: O1

void __thiscall
HashtableAllTest_ConstLocalIterators_Test<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
::~HashtableAllTest_ConstLocalIterators_Test
          (HashtableAllTest_ConstLocalIterators_Test<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
           *this)

{
  (this->
  super_HashtableAllTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ).
  super_HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  .super_Test._vptr_Test = (_func_int **)&PTR__HashtableTest_00c25c38;
  (this->
  super_HashtableAllTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ).
  super_HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  .ht_.
  super_BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
  ._vptr_BaseHashtableInterface = (_func_int **)&PTR__BaseHashtableInterface_00c25cf8;
  std::
  vector<google::sparsegroup<std::pair<const_char_*const,_ValueType>,_(unsigned_short)48,_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>,_Alloc<google::sparsegroup<std::pair<const_char_*const,_ValueType>,_(unsigned_short)48,_Alloc<std::pair<const_char_*const,_ValueType>,_unsigned_long,_18446744073709551615UL>_>,_unsigned_long,_18446744073709551615UL>_>
  ::~vector(&(this->
             super_HashtableAllTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             ).
             super_HashtableTest<google::HashtableInterface_SparseHashMap<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_.
             super_BaseHashtableInterface<google::sparse_hash_map<const_char_*,_ValueType,_Hasher,_Hasher,_Alloc<const_char_*,_unsigned_long,_18446744073709551615UL>_>_>
             .ht_.rep.table.groups);
  testing::Test::~Test((Test *)this);
  operator_delete(this);
  return;
}

Assistant:

TYPED_TEST(HashtableAllTest, ConstLocalIterators) {
  this->ht_.insert(this->UniqueObject(1));
  const typename TypeParam::size_type bucknum =
      this->ht_.bucket(this->UniqueKey(1));
  typename TypeParam::const_local_iterator b = this->ht_.begin(bucknum);
  typename TypeParam::const_local_iterator e = this->ht_.end(bucknum);
  EXPECT_TRUE(b != e);
  b++;
  EXPECT_TRUE(b == e);
  typename TypeParam::const_local_iterator b2 = this->ht_.begin(bucknum ^ 1);
  typename TypeParam::const_local_iterator e2 = this->ht_.end(bucknum ^ 1);
  EXPECT_TRUE(b2 == e2);
}